

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VectorRasterizerTests.cpp
# Opt level: O2

void __thiscall
agge::tests::VectorRasterizerTests::InterCellIndividualHLineIsRepresentedBySparsedCells
          (VectorRasterizerTests *this)

{
  allocator local_111;
  string local_110;
  LocationInfo local_f0;
  cell reference2 [3];
  cell reference1 [3];
  vector_rasterizer vr;
  
  vector_rasterizer::vector_rasterizer(&vr);
  vector_rasterizer::line(&vr,0,0,0x5ff,3);
  reference1._16_6_ = 0x500010000;
  reference1[2].y = 0;
  reference1[2].area = 0xff;
  reference1[2].cover = 1;
  reference1[0].x = 1;
  reference1[0].y = 0;
  reference1[0].area = 0x100;
  reference1[0].cover = 1;
  reference1[1].x = 3;
  reference1[1].y = 0;
  reference1[1].area._0_2_ = 0x100;
  std::__cxx11::string::string
            ((string *)&local_110,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/VectorRasterizerTests.cpp"
             ,(allocator *)reference2);
  ut::LocationInfo::LocationInfo(&local_f0,&local_110,0x2e3);
  ut::
  are_equal<agge::vector_rasterizer::cell_const,3ul,agge::pod_vector<agge::vector_rasterizer::cell>>
            (&reference1,&vr._cells,&local_f0);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  vector_rasterizer::reset(&vr);
  vector_rasterizer::line(&vr,-0x100,0x100,0xaff,0x103);
  reference2._16_6_ = 0xa00010000;
  reference2[2].y = 1;
  reference2[2].area = 0xff;
  reference2[2].cover = 1;
  reference2[0].x = 2;
  reference2[0].y = 1;
  reference2[0].area = 0x100;
  reference2[0].cover = 1;
  reference2[1].x = 6;
  reference2[1].y = 1;
  reference2[1].area._0_2_ = 0x100;
  std::__cxx11::string::string
            ((string *)&local_110,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/VectorRasterizerTests.cpp"
             ,&local_111);
  ut::LocationInfo::LocationInfo(&local_f0,&local_110,0x2f2);
  ut::
  are_equal<agge::vector_rasterizer::cell_const,3ul,agge::pod_vector<agge::vector_rasterizer::cell>>
            (&reference2,&vr._cells,&local_f0);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  vector_rasterizer::~vector_rasterizer(&vr);
  return;
}

Assistant:

test( InterCellIndividualHLineIsRepresentedBySparsedCells )
			{
				// INIT
				vector_rasterizer vr;

				// ACT
				vr.line(0, 0, 1535, 3); // dx = 6 * 256 - 1 (to compensate floating point rounding)

				// ASSERT
				const vector_rasterizer::cell reference1[] = {
					{ 1, 0, 256, 1 },
					{ 3, 0, 256, 1 },
					{ 5, 0, 255, 1 },
				};

				assert_equal(reference1, vr.cells());

				// INIT
				vr.reset();

				// ACT
				vr.line(-256, 256, 2815, 259); // dx = 12 * 256 - 1 (to compensate floating point rounding)

				// ASSERT
				const vector_rasterizer::cell reference2[] = {
					{ 2, 1, 256, 1 },
					{ 6, 1, 256, 1 },
					{ 10, 1, 255, 1 },
				};

				assert_equal(reference2, vr.cells());
			}